

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix4 * matrix4_view_lookat_rh_EXP(matrix4 *self,vector3 *eye,vector3 *target,vector3 *up)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  fVar2 = (target->field_0).v[2] - (eye->field_0).v[2];
  fVar6 = (float)*(undefined8 *)&target->field_0 - (float)*(undefined8 *)&eye->field_0;
  fVar7 = (float)((ulong)*(undefined8 *)&target->field_0 >> 0x20) -
          (float)((ulong)*(undefined8 *)&eye->field_0 >> 0x20);
  fVar3 = SQRT(fVar2 * fVar2 + fVar6 * fVar6 + fVar7 * fVar7);
  auVar8._4_4_ = fVar7;
  auVar8._0_4_ = fVar6;
  auVar8._8_8_ = 0;
  auVar9._4_4_ = fVar3;
  auVar9._0_4_ = fVar3;
  auVar9._8_4_ = fVar3;
  auVar9._12_4_ = fVar3;
  auVar9 = divps(auVar8,auVar9);
  if (1e-05 <= fVar3) {
    fVar2 = fVar2 / fVar3;
  }
  uVar4 = (int)((uint)(1e-05 <= fVar3) << 0x1f) >> 0x1f;
  uVar5 = (int)((uint)(1e-05 <= fVar3) << 0x1f) >> 0x1f;
  uVar1 = CONCAT44(~uVar5 & (uint)fVar7,~uVar4 & (uint)fVar6) |
          CONCAT44(auVar9._4_4_ & uVar5,auVar9._0_4_ & uVar4);
  fVar3 = (float)uVar1;
  fVar6 = (float)(uVar1 >> 0x20);
  fVar13 = (float)*(undefined8 *)&up->field_0;
  fVar10 = (float)((ulong)*(undefined8 *)&up->field_0 >> 0x20);
  fVar7 = fVar6 * (up->field_0).v[2] - fVar10 * fVar2;
  fVar14 = fVar13 * fVar2 - (up->field_0).v[2] * fVar3;
  fVar15 = fVar10 * fVar3 - fVar13 * fVar6;
  fVar16 = SQRT(fVar15 * fVar15 + fVar7 * fVar7 + fVar14 * fVar14);
  auVar11._4_4_ = fVar16;
  auVar11._0_4_ = fVar16;
  auVar11._8_4_ = fVar16;
  auVar11._12_4_ = fVar16;
  auVar12._4_4_ = fVar15;
  auVar12._0_4_ = fVar14;
  auVar12._8_4_ = 0;
  auVar12._12_4_ = 0.0 - fVar10 * 0.0;
  auVar9 = divps(auVar12,auVar11);
  uVar4 = (int)((uint)(1e-05 <= fVar16) << 0x1f) >> 0x1f;
  uVar5 = (int)((uint)(1e-05 <= fVar16) << 0x1f) >> 0x1f;
  fVar13 = (float)(~uVar4 & (uint)fVar14 | auVar9._0_4_ & uVar4);
  fVar14 = (float)(~uVar5 & (uint)fVar15 | auVar9._4_4_ & uVar5);
  if (1e-05 <= fVar16) {
    fVar7 = fVar7 / fVar16;
  }
  fVar10 = fVar2 * fVar13 - fVar6 * fVar14;
  fVar15 = fVar3 * fVar14 - fVar2 * fVar7;
  fVar16 = fVar6 * fVar7 - fVar3 * fVar13;
  (self->field_0).m[3] = 0.0;
  (self->field_0).m[7] = 0.0;
  *(undefined8 *)((long)&self->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&self->field_0 + 0x34) = 0;
  (self->field_0).m[0xf] = 1.0;
  (self->field_0).m[0] = fVar7;
  (self->field_0).m[1] = fVar13;
  (self->field_0).m[2] = fVar14;
  *(ulong *)((long)&self->field_0 + 0x10) = CONCAT44(fVar15,fVar10);
  (self->field_0).m[6] = fVar16;
  *(ulong *)((long)&self->field_0 + 0x20) = uVar1 ^ 0x8000000080000000;
  (self->field_0).m[10] = -fVar2;
  (self->field_0).m[3] =
       -(fVar14 * (eye->field_0).v[2] + fVar7 * (eye->field_0).v[0] + (eye->field_0).v[1] * fVar13);
  (self->field_0).m[7] =
       -(fVar16 * (eye->field_0).v[2] + fVar10 * (eye->field_0).v[0] + fVar15 * (eye->field_0).v[1])
  ;
  (self->field_0).m[0xb] =
       -(fVar2 * (eye->field_0).v[2] + (eye->field_0).v[0] * fVar3 + (eye->field_0).v[1] * fVar6);
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_view_lookat_rh_EXP(struct matrix4 *self, const struct vector3 *eye, const struct vector3 *target, const struct vector3 *up)
{
	struct vector3 yaxis;
	struct vector3 zaxis;
	struct vector3 xaxis;

	zaxis.x = target->x - eye->x;
	zaxis.y = target->y - eye->y;
	zaxis.z = target->z - eye->z;
	vector3_normalize(&zaxis);

	/* xaxis = zaxis x up */
	vector3_cross_product(&xaxis, &zaxis, up);
	vector3_normalize(&xaxis);

	/* yaxis = xaxis x zaxis */
	vector3_cross_product(&yaxis, &xaxis, &zaxis);

	matrix4_identity(self);

	self->c00 = xaxis.x;
	self->c10 = xaxis.y;
	self->c20 = xaxis.z;

	self->c01 = yaxis.x;
	self->c11 = yaxis.y;
	self->c21 = yaxis.z;

	self->c02 = -zaxis.x;
	self->c12 = -zaxis.y;
	self->c22 = -zaxis.z;

	self->c30 = -vector3_dot_product(&xaxis, eye);
	self->c31 = -vector3_dot_product(&yaxis, eye);
	self->c32 = -vector3_dot_product(&zaxis, eye);

	return self;
}